

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O1

void __thiscall
encoder_Hx_basic_demo_Test::~encoder_Hx_basic_demo_Test(encoder_Hx_basic_demo_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(encoder, Hx_basic_demo) {
    std::array<Bit, AutogenLDPC::N> input{};
    std::array<Bit, AutogenLDPC::M> output{};

    std::cout << "------------------------\n";
    std::cout << "Input nonzeros:\n";
    vec_to_arr<Bit, AutogenLDPC::N>(get_bitstring(AutogenLDPC::N), input);
    // noise_bitstring_inplace(input, 0.5, seed);

    print_nz_inds(input);

    std::cout << "------------------------\n";

    encode(input, output);

    std::cout << "Syndrome nonzeros:\n";
    print_nz_inds(output);

    std::cout << "------------------------\n";

    std::cout << "Syndrome hash: " << hash_vector(output) << std::endl;
}